

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AlterRenameTable(Parse *pParse,SrcList *pSrc,Token *pName)

{
  u32 uVar1;
  sqlite3 *db;
  Schema *pSVar2;
  int iVar3;
  Table *pTVar4;
  char *zName;
  Table *pTVar5;
  Index *pIVar6;
  VTable **ppVVar7;
  Vdbe *p;
  Parse *pPVar8;
  undefined4 extraout_var;
  Schema **ppSVar9;
  VTable *zP4;
  char *pcVar10;
  int iDb;
  char *pcVar11;
  
  db = pParse->db;
  uVar1 = db->mDbFlags;
  if ((db->mallocFailed == '\0') &&
     (pTVar4 = sqlite3LocateTableItem(pParse,0,pSrc->a), pTVar4 != (Table *)0x0)) {
    if (pTVar4->pSchema == (Schema *)0x0) {
      iDb = -1000000;
    }
    else {
      iDb = -1;
      ppSVar9 = &pParse->db->aDb->pSchema;
      do {
        iDb = iDb + 1;
        pSVar2 = *ppSVar9;
        ppSVar9 = ppSVar9 + 4;
      } while (pSVar2 != pTVar4->pSchema);
    }
    pcVar11 = db->aDb[iDb].zDbSName;
    db->mDbFlags = db->mDbFlags | 2;
    zName = sqlite3NameFromToken(db,pName);
    if (zName != (char *)0x0) {
      pTVar5 = sqlite3FindTable(db,zName,pcVar11);
      if ((pTVar5 == (Table *)0x0) &&
         (pIVar6 = sqlite3FindIndex(db,zName,pcVar11), pIVar6 == (Index *)0x0)) {
        iVar3 = isAlterableTable(pParse,pTVar4);
        if ((iVar3 == 0) && (iVar3 = sqlite3CheckObjectName(pParse,zName), iVar3 == 0)) {
          pcVar10 = pTVar4->zName;
          if (pTVar4->pSelect != (Select *)0x0) {
            pcVar11 = "view %s may not be altered";
            goto LAB_00168d51;
          }
          iVar3 = sqlite3AuthCheck(pParse,0x1a,pcVar11,pcVar10,(char *)0x0);
          if ((iVar3 == 0) && (iVar3 = sqlite3ViewGetColumnNames(pParse,pTVar4), iVar3 == 0)) {
            if (pTVar4->nModuleArg == 0) {
              zP4 = (VTable *)0x0;
            }
            else {
              ppVVar7 = &pTVar4->pVTable;
              do {
                zP4 = *ppVVar7;
                ppVVar7 = &zP4->pNext;
              } while (zP4->db != db);
              if (zP4->pVtab->pModule->xRename == (_func_int_sqlite3_vtab_ptr_char_ptr *)0x0) {
                zP4 = (VTable *)0x0;
              }
            }
            p = sqlite3GetVdbe(pParse);
            if (p != (Vdbe *)0x0) {
              pPVar8 = pParse->pToplevel;
              if (pParse->pToplevel == (Parse *)0x0) {
                pPVar8 = pParse;
              }
              pPVar8->mayAbort = '\x01';
              pcVar10 = pTVar4->zName;
              iVar3 = sqlite3Utf8CharLen(pcVar10,-1);
              sqlite3NestedParse(pParse,
                                 "UPDATE \"%w\".%s SET sql = sqlite_rename_table(%Q, type, name, sql, %Q, %Q, %d) WHERE (type!=\'index\' OR tbl_name=%Q COLLATE nocase)AND   name NOT LIKE \'sqlite_%%\'"
                                 ,pcVar11,"sqlite_master",pcVar11,pcVar10,zName,(ulong)(iDb == 1),
                                 pcVar10);
              sqlite3NestedParse(pParse,
                                 "UPDATE %Q.%s SET tbl_name = %Q, name = CASE WHEN type=\'table\' THEN %Q WHEN name LIKE \'sqlite_autoindex%%\' AND type=\'index\' THEN \'sqlite_autoindex_\' || %Q || substr(name,%d+18) ELSE name END WHERE tbl_name=%Q COLLATE nocase AND (type=\'table\' OR type=\'index\' OR type=\'trigger\');"
                                 ,pcVar11,"sqlite_master",zName,zName,zName,
                                 CONCAT44(extraout_var,iVar3),pcVar10);
              pTVar4 = sqlite3FindTable(db,"sqlite_sequence",pcVar11);
              if (pTVar4 != (Table *)0x0) {
                sqlite3NestedParse(pParse,
                                   "UPDATE \"%w\".sqlite_sequence set name = %Q WHERE name = %Q",
                                   pcVar11);
              }
              if (iDb != 1) {
                sqlite3NestedParse(pParse,
                                   "UPDATE sqlite_temp_master SET sql = sqlite_rename_table(%Q, type, name, sql, %Q, %Q, 1), tbl_name = CASE WHEN tbl_name=%Q COLLATE nocase AND           sqlite_rename_test(%Q, sql, type, name, 1) THEN %Q ELSE tbl_name END WHERE type IN (\'view\', \'trigger\')"
                                  );
              }
              if (zP4 != (VTable *)0x0) {
                iVar3 = pParse->nMem + 1;
                pParse->nMem = iVar3;
                sqlite3VdbeLoadString(p,iVar3,zName);
                iVar3 = sqlite3VdbeAddOp3(p,0xa5,iVar3,0,0);
                sqlite3VdbeChangeP4(p,iVar3,(char *)zP4,-0xc);
              }
              renameReloadSchema(pParse,iDb);
              renameTestSchema(pParse,pcVar11,(uint)(iDb == 1));
            }
          }
        }
      }
      else {
        pcVar11 = "there is already another table or index with this name: %s";
        pcVar10 = zName;
LAB_00168d51:
        sqlite3ErrorMsg(pParse,pcVar11,pcVar10);
      }
      sqlite3SrcListDelete(db,pSrc);
      sqlite3DbFreeNN(db,zName);
      goto LAB_00168c95;
    }
  }
  sqlite3SrcListDelete(db,pSrc);
LAB_00168c95:
  db->mDbFlags = uVar1;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterRenameTable(
  Parse *pParse,            /* Parser context. */
  SrcList *pSrc,            /* The table to rename. */
  Token *pName              /* The new table name. */
){
  int iDb;                  /* Database that contains the table */
  char *zDb;                /* Name of database iDb */
  Table *pTab;              /* Table being renamed */
  char *zName = 0;          /* NULL-terminated version of pName */ 
  sqlite3 *db = pParse->db; /* Database connection */
  int nTabName;             /* Number of UTF-8 characters in zTabName */
  const char *zTabName;     /* Original name of the table */
  Vdbe *v;
  VTable *pVTab = 0;        /* Non-zero if this is a v-tab with an xRename() */
  u32 savedDbFlags;         /* Saved value of db->mDbFlags */

  savedDbFlags = db->mDbFlags;  
  if( NEVER(db->mallocFailed) ) goto exit_rename_table;
  assert( pSrc->nSrc==1 );
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );

  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_rename_table;
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  zDb = db->aDb[iDb].zDbSName;
  db->mDbFlags |= DBFLAG_PreferBuiltin;

  /* Get a NULL terminated version of the new table name. */
  zName = sqlite3NameFromToken(db, pName);
  if( !zName ) goto exit_rename_table;

  /* Check that a table or index named 'zName' does not already exist
  ** in database iDb. If so, this is an error.
  */
  if( sqlite3FindTable(db, zName, zDb) || sqlite3FindIndex(db, zName, zDb) ){
    sqlite3ErrorMsg(pParse, 
        "there is already another table or index with this name: %s", zName);
    goto exit_rename_table;
  }

  /* Make sure it is not a system table being altered, or a reserved name
  ** that the table is being renamed to.
  */
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ){
    goto exit_rename_table;
  }
  if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){ goto
    exit_rename_table;
  }

#ifndef SQLITE_OMIT_VIEW
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "view %s may not be altered", pTab->zName);
    goto exit_rename_table;
  }
#endif

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    goto exit_rename_table;
  }
#endif

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_rename_table;
  }
  if( IsVirtual(pTab) ){
    pVTab = sqlite3GetVTable(db, pTab);
    if( pVTab->pVtab->pModule->xRename==0 ){
      pVTab = 0;
    }
  }
#endif

  /* Begin a transaction for database iDb. Then modify the schema cookie
  ** (since the ALTER TABLE modifies the schema). Call sqlite3MayAbort(),
  ** as the scalar functions (e.g. sqlite_rename_table()) invoked by the 
  ** nested SQL may raise an exception.  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ){
    goto exit_rename_table;
  }
  sqlite3MayAbort(pParse);

  /* figure out how many UTF-8 characters are in zName */
  zTabName = pTab->zName;
  nTabName = sqlite3Utf8CharLen(zTabName, -1);

  /* Rewrite all CREATE TABLE, INDEX, TRIGGER or VIEW statements in
  ** the schema to use the new table name.  */
  sqlite3NestedParse(pParse, 
      "UPDATE \"%w\".%s SET "
      "sql = sqlite_rename_table(%Q, type, name, sql, %Q, %Q, %d) "
      "WHERE (type!='index' OR tbl_name=%Q COLLATE nocase)"
      "AND   name NOT LIKE 'sqlite_%%'"
      , zDb, MASTER_NAME, zDb, zTabName, zName, (iDb==1), zTabName
  );

  /* Update the tbl_name and name columns of the sqlite_master table
  ** as required.  */
  sqlite3NestedParse(pParse,
      "UPDATE %Q.%s SET "
          "tbl_name = %Q, "
          "name = CASE "
            "WHEN type='table' THEN %Q "
            "WHEN name LIKE 'sqlite_autoindex%%' AND type='index' THEN "
             "'sqlite_autoindex_' || %Q || substr(name,%d+18) "
            "ELSE name END "
      "WHERE tbl_name=%Q COLLATE nocase AND "
          "(type='table' OR type='index' OR type='trigger');", 
      zDb, MASTER_NAME, 
      zName, zName, zName, 
      nTabName, zTabName
  );

#ifndef SQLITE_OMIT_AUTOINCREMENT
  /* If the sqlite_sequence table exists in this database, then update 
  ** it with the new table name.
  */
  if( sqlite3FindTable(db, "sqlite_sequence", zDb) ){
    sqlite3NestedParse(pParse,
        "UPDATE \"%w\".sqlite_sequence set name = %Q WHERE name = %Q",
        zDb, zName, pTab->zName);
  }
#endif

  /* If the table being renamed is not itself part of the temp database,
  ** edit view and trigger definitions within the temp database 
  ** as required.  */
  if( iDb!=1 ){
    sqlite3NestedParse(pParse, 
        "UPDATE sqlite_temp_master SET "
            "sql = sqlite_rename_table(%Q, type, name, sql, %Q, %Q, 1), "
            "tbl_name = "
              "CASE WHEN tbl_name=%Q COLLATE nocase AND "
              "          sqlite_rename_test(%Q, sql, type, name, 1) "
              "THEN %Q ELSE tbl_name END "
            "WHERE type IN ('view', 'trigger')"
        , zDb, zTabName, zName, zTabName, zDb, zName);
  }

  /* If this is a virtual table, invoke the xRename() function if
  ** one is defined. The xRename() callback will modify the names
  ** of any resources used by the v-table implementation (including other
  ** SQLite tables) that are identified by the name of the virtual table.
  */
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( pVTab ){
    int i = ++pParse->nMem;
    sqlite3VdbeLoadString(v, i, zName);
    sqlite3VdbeAddOp4(v, OP_VRename, i, 0, 0,(const char*)pVTab, P4_VTAB);
  }
#endif

  renameReloadSchema(pParse, iDb);
  renameTestSchema(pParse, zDb, iDb==1);

exit_rename_table:
  sqlite3SrcListDelete(db, pSrc);
  sqlite3DbFree(db, zName);
  db->mDbFlags = savedDbFlags;
}